

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_manager.cpp
# Opt level: O3

void __thiscall
jessilib::io::command_manager::unregister_command(command_manager *this,basic_command *in_command)

{
  int iVar1;
  __normal_iterator<jessilib::io::basic_command_**,_std::vector<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>_>
  _Var2;
  basic_command *local_20;
  
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->m_commands_mutex);
  if (iVar1 != 0x23) {
    local_20 = in_command;
    _Var2 = std::
            __remove_if<__gnu_cxx::__normal_iterator<jessilib::io::basic_command**,std::vector<jessilib::io::basic_command*,std::allocator<jessilib::io::basic_command*>>>,__gnu_cxx::__ops::_Iter_equals_val<jessilib::io::basic_command*const>>
                      ((__normal_iterator<jessilib::io::basic_command_**,_std::vector<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>_>
                        )(this->m_commands).
                         super__Vector_base<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<jessilib::io::basic_command_**,_std::vector<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>_>
                        )(this->m_commands).
                         super__Vector_base<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_20);
    if (_Var2._M_current !=
        (this->m_commands).
        super__Vector_base<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (this->m_commands).
      super__Vector_base<jessilib::io::basic_command_*,_std::allocator<jessilib::io::basic_command_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = _Var2._M_current;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_commands_mutex);
    return;
  }
  std::__throw_system_error(0x23);
}

Assistant:

void command_manager::unregister_command(basic_command& in_command) {
	std::lock_guard<std::shared_mutex> guard{ m_commands_mutex };
	std::erase(m_commands, &in_command);
}